

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O2

void DCCorrection(double *input,double f0,int fs,int fft_size,double *output)

{
  uint uVar1;
  double *yi;
  double *xi;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  int iVar5;
  double dVar6;
  double dVar7;
  
  dVar6 = (double)fft_size;
  dVar7 = (double)fs;
  iVar5 = (int)((dVar6 * f0) / dVar7);
  uVar1 = iVar5 + 2;
  uVar4 = 0xffffffffffffffff;
  if (-3 < iVar5) {
    uVar4 = (long)(int)uVar1 * 8;
  }
  yi = (double *)operator_new__(uVar4);
  xi = (double *)operator_new__(uVar4);
  uVar2 = 0;
  uVar4 = (ulong)uVar1;
  if ((int)uVar1 < 1) {
    uVar4 = uVar2;
  }
  for (; uVar4 != uVar2; uVar2 = uVar2 + 1) {
    xi[uVar2] = ((double)(int)uVar2 * dVar7) / dVar6;
  }
  interp1Q(f0 - *xi,-dVar7 / dVar6,input,iVar5 + 3,xi,iVar5 + 1,yi);
  for (lVar3 = 0; lVar3 <= iVar5; lVar3 = lVar3 + 1) {
    output[lVar3] = input[lVar3] + yi[lVar3];
  }
  operator_delete__(yi);
  operator_delete__(xi);
  return;
}

Assistant:

void DCCorrection(const double *input, double f0, int fs, int fft_size,
    double *output) {
  int upper_limit = 2 + static_cast<int>(f0 * fft_size / fs);
  double *low_frequency_replica = new double[upper_limit];
  double *low_frequency_axis = new double[upper_limit];

  for (int i = 0; i < upper_limit; ++i)
    low_frequency_axis[i] = static_cast<double>(i) * fs / fft_size;

  int upper_limit_replica = upper_limit - 1;
  interp1Q(f0 - low_frequency_axis[0],
      -static_cast<double>(fs) / fft_size, input, upper_limit + 1,
      low_frequency_axis, upper_limit_replica, low_frequency_replica);

  for (int i = 0; i < upper_limit_replica; ++i)
    output[i] = input[i] + low_frequency_replica[i];

  delete[] low_frequency_replica;
  delete[] low_frequency_axis;
}